

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O3

void __thiscall wasm::SIMDShift::finalize(SIMDShift *this)

{
  Expression *pEVar1;
  Expression *pEVar2;
  
  pEVar1 = this->vec;
  if ((pEVar1 != (Expression *)0x0) && (pEVar2 = this->shift, pEVar2 != (Expression *)0x0)) {
    (this->super_SpecificExpression<(wasm::Expression::Id)33>).super_Expression.type.id = 6;
    if (((pEVar1->type).id == 1) || ((pEVar2->type).id == 1)) {
      (this->super_SpecificExpression<(wasm::Expression::Id)33>).super_Expression.type.id = 1;
    }
    return;
  }
  __assert_fail("vec && shift",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/wasm.cpp"
                ,0x1cc,"void wasm::SIMDShift::finalize()");
}

Assistant:

void SIMDShift::finalize() {
  assert(vec && shift);
  type = Type::v128;
  if (vec->type == Type::unreachable || shift->type == Type::unreachable) {
    type = Type::unreachable;
  }
}